

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

KeyData * __thiscall
cfd::core::KeyData::DerivePubkey
          (KeyData *__return_storage_ptr__,KeyData *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *path,bool has_rebase_path)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __result;
  size_type sVar2;
  size_type sVar3;
  undefined8 uVar4;
  ExtPubkey *in_stack_fffffffffffffd40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffd50;
  string *message;
  undefined8 in_stack_fffffffffffffd58;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffd60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffd88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffd90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  undefined1 local_241 [33];
  CfdSourceLocation local_220;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_208;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_200;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_1f8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_1f0;
  undefined1 local_1e8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> join_path_1;
  undefined1 local_1b8 [8];
  ByteData fp_1;
  ExtPubkey key_1;
  undefined1 local_110 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> join_path;
  Privkey local_e8;
  Pubkey local_c8;
  undefined1 local_b0 [8];
  ByteData fp;
  ExtPubkey key;
  bool has_rebase_path_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *path_local;
  KeyData *this_local;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffd58 >> 0x20);
  bVar1 = ExtPrivkey::IsValid(&this->extprivkey_);
  if (bVar1) {
    ExtPrivkey::DerivePubkey
              ((ExtPubkey *)
               &fp.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&this->extprivkey_,path);
    if (has_rebase_path) {
      ExtPrivkey::GetPrivkey(&local_e8,&this->extprivkey_);
      Privkey::GeneratePubkey(&local_c8,&local_e8,true);
      Pubkey::GetFingerprint((ByteData *)local_b0,&local_c8,4);
      Pubkey::~Pubkey((Pubkey *)0x44ca54);
      Privkey::~Privkey((Privkey *)0x44ca60);
      KeyData(__return_storage_ptr__,
              (ExtPubkey *)
              &fp.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,path,(ByteData *)local_b0);
      join_path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      ByteData::~ByteData((ByteData *)0x44ca99);
    }
    else {
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_110;
      sVar2 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
      sVar3 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(path);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(this_00,sVar2 + sVar3);
      __first = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(path);
      __last = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(path);
      __result = ::std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_110);
      ::std::
      copy<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )__first._M_current,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )__last._M_current,__result);
      KeyData(__return_storage_ptr__,
              (ExtPubkey *)
              &fp.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_110,&this->fingerprint_);
      join_path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffd50)
      ;
    }
    ExtPubkey::~ExtPubkey(in_stack_fffffffffffffd40);
  }
  else {
    bVar1 = ExtPubkey::IsValid(&this->extpubkey_);
    if (!bVar1) {
      local_220.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_hdwallet.cpp"
                   ,0x2f);
      local_220.filename = local_220.filename + 1;
      local_220.line = 0x54a;
      local_220.funcname = "DerivePubkey";
      logger::warn<>(&local_220,"Failed to invalid extPubkey.");
      uVar4 = __cxa_allocate_exception(0x30);
      message = (string *)local_241;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)(local_241 + 1),"Failed to invalid extPubkey.",(allocator *)message);
      CfdException::CfdException(in_stack_fffffffffffffd60,error_code,message);
      __cxa_throw(uVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ExtPubkey::DerivePubkey
              ((ExtPubkey *)
               &fp_1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,&this->extpubkey_,path);
    if (has_rebase_path) {
      ExtPubkey::GetPubkey
                ((Pubkey *)
                 &join_path_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&this->extpubkey_);
      Pubkey::GetFingerprint
                ((ByteData *)local_1b8,
                 (Pubkey *)
                 &join_path_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,4);
      Pubkey::~Pubkey((Pubkey *)0x44ccfc);
      KeyData(__return_storage_ptr__,
              (ExtPubkey *)
              &fp_1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,path,(ByteData *)local_1b8);
      join_path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      ByteData::~ByteData((ByteData *)0x44cd35);
    }
    else {
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      sVar2 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e8);
      sVar3 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(path);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e8,sVar2 + sVar3);
      local_1f0._M_current =
           (uint *)::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(path);
      local_1f8._M_current =
           (uint *)::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(path);
      local_200 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  ::std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e8);
      local_208 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  ::std::
                  copy<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                            (local_1f0,local_1f8,
                             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              )local_200);
      KeyData(__return_storage_ptr__,
              (ExtPubkey *)
              &fp_1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e8,&this->fingerprint_);
      join_path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffd50)
      ;
    }
    ExtPubkey::~ExtPubkey(in_stack_fffffffffffffd40);
  }
  return __return_storage_ptr__;
}

Assistant:

KeyData KeyData::DerivePubkey(
    std::vector<uint32_t> path, bool has_rebase_path) const {
  if (extprivkey_.IsValid()) {
    auto key = extprivkey_.DerivePubkey(path);
    if (has_rebase_path) {
      auto fp = extprivkey_.GetPrivkey().GeneratePubkey().GetFingerprint();
      return KeyData(key, path, fp);
    } else {
      auto join_path = path_;
      join_path.reserve(join_path.size() + path.size());
      std::copy(path.begin(), path.end(), std::back_inserter(join_path));
      return KeyData(key, join_path, fingerprint_);
    }
  } else if (extpubkey_.IsValid()) {
    auto key = extpubkey_.DerivePubkey(path);
    if (has_rebase_path) {
      auto fp = extpubkey_.GetPubkey().GetFingerprint();
      return KeyData(key, path, fp);
    } else {
      auto join_path = path_;
      join_path.reserve(join_path.size() + path.size());
      std::copy(path.begin(), path.end(), std::back_inserter(join_path));
      return KeyData(key, join_path, fingerprint_);
    }
  } else {
    warn(CFD_LOG_SOURCE, "Failed to invalid extPubkey.");
    throw CfdException(
        CfdError::kCfdIllegalStateError, "Failed to invalid extPubkey.");
  }
}